

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O0

int rne(int x)

{
  int iVar1;
  bool bVar2;
  undefined4 local_10;
  int n;
  int x_local;
  
  local_10 = 1;
  while( true ) {
    bVar2 = false;
    if (local_10 < 10) {
      iVar1 = rnf(2,x + 2);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

static inline int rne(int x)
{
	int n;

	n = 1;
	/* Slightly higher probabilities for higher n than in NetHack 3.4.3
	 * p(n) = \left(\frac{2}{x+2}\right)^{n-1} \frac{x}{x+2} */
	while (n < 10 && rnf(2, x + 2))
		n++;
	return n;
}